

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::blueprint_helpers::parseExponentWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  bool bVar1;
  char16_t cVar2;
  int32_t iVar3;
  int minExponentDigits;
  int index;
  Notation NVar4;
  
  minExponentDigits = 0;
  cVar2 = numparse::impl::StringSegment::charAt(segment,0);
  bVar1 = false;
  if (cVar2 == L'+') {
    iVar3 = numparse::impl::StringSegment::length(segment);
    index = 1;
    if (1 < iVar3) {
      index = 1;
      do {
        cVar2 = numparse::impl::StringSegment::charAt(segment,index);
        if (cVar2 != L'e') break;
        index = index + 1;
        iVar3 = numparse::impl::StringSegment::length(segment);
      } while (index < iVar3);
      minExponentDigits = index + -1;
    }
    iVar3 = numparse::impl::StringSegment::length(segment);
    bVar1 = iVar3 <= index;
    if (iVar3 <= index) {
      NVar4 = (Notation)
              ScientificNotation::withMinExponentDigits
                        ((ScientificNotation *)&macros->notation,minExponentDigits);
      macros->notation = NVar4;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool blueprint_helpers::parseExponentWidthOption(const StringSegment& segment, MacroProps& macros,
                                                 UErrorCode&) {
    if (segment.charAt(0) != u'+') {
        return false;
    }
    int32_t offset = 1;
    int32_t minExp = 0;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'e') {
            minExp++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        return false;
    }
    // Use the public APIs to enforce bounds checking
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withMinExponentDigits(minExp);
    return true;
}